

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O0

long __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::do_hash
          (collate_impl<wchar_t> *this,level_type level,wchar_t *b,wchar_t *e)

{
  state_type sVar1;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp;
  undefined4 in_stack_00000058;
  collate_impl<wchar_t> *in_stack_00000068;
  value_type_conflict2 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  
  do_basic_transform(in_stack_00000068,this._4_4_,(wchar_t *)CONCAT44(level,in_stack_00000058),b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  sVar1 = gnu_gettext::pj_winberger_hash_function
                    ((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  uVar2 = (ulong)sVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffb0);
  return uVar2;
}

Assistant:

long do_hash(level_type level,CharType const *b,CharType const *e) const
                {
                    std::vector<uint8_t> tmp = do_basic_transform(level,b,e);
                    tmp.push_back(0);
                    return gnu_gettext::pj_winberger_hash_function(reinterpret_cast<char *>(&tmp.front()));
                }